

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
::_reduce(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
          *this)

{
  Characteristic CVar1;
  Column_settings *this_00;
  ID_index IVar2;
  bool bVar3;
  Index IVar4;
  int iVar5;
  Dimension DVar6;
  Field_element FVar7;
  uint uVar8;
  uint uVar9;
  Base_matrix *pBVar10;
  reference this_01;
  reference pvVar11;
  reference puVar12;
  pointer ppVar13;
  Characteristic *pCVar14;
  Column *this_02;
  ulong uVar15;
  size_type sVar16;
  reference pvVar17;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar18;
  uint local_2c4;
  ID_index local_2b4;
  uint local_264;
  ID_index local_254;
  uint local_1ac;
  uint local_1a8;
  uint d;
  Index i_2;
  Persistence_interval<int,_unsigned_int> *local_198;
  int local_18c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_188;
  undefined1 local_180;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_178;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_170;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_168;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_160;
  Column_settings *local_158;
  Field_operators *operators;
  Column *pCStack_148;
  Element coef;
  Column *toadd;
  uint local_134;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_130;
  Index pivotKiller;
  iterator itNeg;
  ID_index local_11c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_118;
  Index pivotColumnNumber;
  iterator it;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_108;
  ID_index pivot;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_100;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
  *local_f8;
  Column *curr;
  const_iterator cStack_e8;
  Index i_1;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cols;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2_1;
  reference pvStack_a8;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  undefined1 local_80 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columnsByDim;
  int dim;
  allocator<std::pair<const_unsigned_int,_unsigned_int>_> local_53;
  key_equal local_52;
  hasher local_51;
  undefined1 local_50 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  negativeColumns;
  Index nullIndex;
  Pos_index nullDeath;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
  *this_local;
  
  negativeColumns._M_h._M_single_bucket._4_4_ = 0xffffffff;
  negativeColumns._M_h._M_single_bucket._0_4_ = 0xffffffff;
  pBVar10 = _matrix(this);
  IVar4 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
          ::get_number_of_columns(pBVar10);
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::allocator(&local_53);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_50,(ulong)IVar4,&local_51,&local_52,&local_53);
  std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>::~allocator(&local_53);
  pBVar10 = _matrix(this);
  columnsByDim.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       Matrix_all_dimension_holder<int>::get_max_dimension(&pBVar10->super_Matrix_dimension_option);
  iVar5 = (int)columnsByDim.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&__range2 + 7));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_80,(long)iVar5,
           (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
           ((long)&__range2 + 7));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&__range2 + 7));
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_80);
  v = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_80);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&v), bVar3) {
    pvVar11 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    pvStack_a8 = pvVar11;
    pBVar10 = _matrix(this);
    IVar4 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
            ::get_number_of_columns(pBVar10);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvVar11,(ulong)IVar4);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
  }
  __range2_1._4_4_ = 0;
  while( true ) {
    uVar8 = __range2_1._4_4_;
    pBVar10 = _matrix(this);
    IVar4 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
            ::get_number_of_columns(pBVar10);
    iVar5 = (int)columnsByDim.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (IVar4 <= uVar8) break;
    pBVar10 = _matrix(this);
    DVar6 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
            ::get_column_dimension(pBVar10,__range2_1._4_4_);
    this_01 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)local_80,(long)(iVar5 - DVar6));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this_01,(value_type_conflict *)((long)&__range2_1 + 4));
    __range2_1._4_4_ = __range2_1._4_4_ + 1;
  }
  __end0_1 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_80);
  cols = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::
         vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_80);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                             *)&cols), bVar3) {
    pvVar11 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0_1);
    __end0_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar11);
    cStack_e8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar11);
    while (bVar3 = __gnu_cxx::operator!=(&__end0_2,&stack0xffffffffffffff18), bVar3) {
      puVar12 = __gnu_cxx::
                __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end0_2);
      curr._4_4_ = *puVar12;
      pBVar10 = _matrix(this);
      local_f8 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                 ::get_column(pBVar10,curr._4_4_);
      bVar3 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
              ::is_empty(local_f8);
      if (bVar3) {
        local_100._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)local_50,(key_type *)((long)&curr + 4));
        _Stack_108._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_50);
        bVar3 = std::__detail::operator==(&local_100,&stack0xfffffffffffffef8);
        if (bVar3) {
          std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                    ((vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                      *)&this->barcode_,(uint *)((long)&curr + 4),
                     (uint *)((long)&negativeColumns._M_h._M_single_bucket + 4),
                     (int *)&columnsByDim.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      else {
        it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
        _4_4_ = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                ::get_pivot(local_f8);
        _Stack_118._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find(&this->idToPosition_,
                    (key_type *)
                    ((long)&it.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur + 4));
        itNeg = std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::end(&this->idToPosition_);
        bVar3 = std::__detail::operator==
                          (&stack0xfffffffffffffee8,
                           &itNeg.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          );
        if (bVar3) {
          local_254 = it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur._4_4_;
        }
        else {
          ppVar13 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                *)&stack0xfffffffffffffee8);
          local_254 = ppVar13->second;
        }
        local_11c = local_254;
        _Stack_130._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)local_50,&local_11c);
        toadd = (Column *)
                std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_50);
        bVar3 = std::__detail::operator==
                          (&stack0xfffffffffffffed0,
                           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            *)&toadd);
        if (bVar3) {
          local_264 = 0xffffffff;
        }
        else {
          ppVar13 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                *)&stack0xfffffffffffffed0);
          local_264 = ppVar13->second;
        }
        local_134 = local_264;
        while( true ) {
          IVar2 = it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur._4_4_;
          uVar9 = Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>
                  ::get_null_value<unsigned_int>();
          uVar8 = local_134;
          bVar3 = false;
          if (IVar2 != uVar9) {
            uVar9 = Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>
                    ::get_null_value<unsigned_int>();
            bVar3 = uVar8 != uVar9;
          }
          IVar2 = it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur._4_4_;
          if (!bVar3) break;
          pBVar10 = _matrix(this);
          pCStack_148 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                        ::get_column(pBVar10,local_134);
          operators._4_4_ =
               Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
               ::get_pivot_value(pCStack_148);
          pBVar10 = _matrix(this);
          local_158 = pBVar10->colSettings_;
          operators._4_4_ =
               persistence_fields::Zp_field_operators<unsigned_int,_void>::get_inverse
                         (&local_158->operators,operators._4_4_);
          this_00 = local_158;
          pCVar14 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_characteristic
                              (&local_158->operators);
          CVar1 = *pCVar14;
          FVar7 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                  ::get_pivot_value(local_f8);
          persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                    (&this_00->operators,(Element *)((long)&operators + 4),CVar1 - FVar7);
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
          ::multiply_source_and_add(local_f8,pCStack_148,(Field_element *)((long)&operators + 4));
          it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
          _4_4_ = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                  ::get_pivot(local_f8);
          local_160._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::find(&this->idToPosition_,
                      (key_type *)
                      ((long)&it.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 4));
          _Stack_118._M_cur = local_160._M_cur;
          local_168._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end(&this->idToPosition_);
          bVar3 = std::__detail::operator==(&stack0xfffffffffffffee8,&local_168);
          if (bVar3) {
            local_2b4 = it.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur._4_4_;
          }
          else {
            ppVar13 = std::__detail::
                      _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                      operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                  *)&stack0xfffffffffffffee8);
            local_2b4 = ppVar13->second;
          }
          local_11c = local_2b4;
          local_170._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)local_50,&local_11c);
          _Stack_130._M_cur = local_170._M_cur;
          local_178._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                      *)local_50);
          bVar3 = std::__detail::operator==(&stack0xfffffffffffffed0,&local_178);
          if (bVar3) {
            local_2c4 = 0xffffffff;
          }
          else {
            ppVar13 = std::__detail::
                      _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                      operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                  *)&stack0xfffffffffffffed0);
            local_2c4 = ppVar13->second;
          }
          local_134 = local_2c4;
        }
        uVar8 = Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>
                ::get_null_value<unsigned_int>();
        if (IVar2 == uVar8) {
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
          ::clear(local_f8);
          std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                    ((vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                      *)&this->barcode_,(uint *)((long)&curr + 4),
                     (uint *)((long)&negativeColumns._M_h._M_single_bucket + 4),
                     (int *)&columnsByDim.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          pVar18 = std::
                   unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                   ::emplace<unsigned_int&,unsigned_int&>
                             ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                               *)local_50,&local_11c,(uint *)((long)&curr + 4));
          local_188._M_cur =
               (__node_type *)
               pVar18.first.
               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
          local_180 = pVar18.second;
          pBVar10 = _matrix(this);
          this_02 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                    ::get_column(pBVar10,local_11c);
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
          ::clear(this_02);
          local_18c = (int)columnsByDim.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + -1;
          std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int&,int>
                    ((vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                      *)&this->barcode_,&local_11c,(uint *)((long)&curr + 4),&local_18c);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end0_2);
    }
    columnsByDim.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (int)columnsByDim.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + -1;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0_1);
  }
  local_198 = (Persistence_interval<int,_unsigned_int> *)
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ::begin(&this->barcode_);
  _i_2 = std::
         vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end(&this->barcode_);
  std::
  sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>
            (local_198,_i_2);
  for (local_1a8 = 0; uVar15 = (ulong)local_1a8,
      sVar16 = std::
               vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ::size(&this->barcode_), uVar15 < sVar16; local_1a8 = local_1a8 + 1) {
    pvVar17 = std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
              ::operator[](&this->barcode_,(ulong)local_1a8);
    uVar8 = pvVar17->death;
    local_1ac = uVar8;
    uVar9 = Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>
            ::get_null_value<unsigned_int>();
    if (uVar8 != uVar9) {
      std::
      unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::emplace<unsigned_int&,unsigned_int&>
                ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  *)&this->deathToBar_,&local_1ac,&local_1a8);
    }
  }
  this->isReduced_ = true;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_80);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_50);
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_reduce() 
{
  constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();
  constexpr const Index nullIndex = Master_matrix::template get_null_value<Index>();

  std::unordered_map<Index, Index> negativeColumns(_matrix()->get_number_of_columns());

  auto dim = _matrix()->get_max_dimension();
  std::vector<std::vector<Index> > columnsByDim(dim + 1);
  for (auto& v : columnsByDim) v.reserve(_matrix()->get_number_of_columns());
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    columnsByDim[dim - _matrix()->get_column_dimension(i)].push_back(i);
  }

  for (const auto& cols : columnsByDim) {
    for (Index i : cols) {
      auto& curr = _matrix()->get_column(i);
      if (curr.is_empty()) {
        if (negativeColumns.find(i) == negativeColumns.end()) {
          barcode_.emplace_back(i, nullDeath, dim);
        }
      } else {
        ID_index pivot = curr.get_pivot();
        auto it = idToPosition_.find(pivot);
        Index pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
        auto itNeg = negativeColumns.find(pivotColumnNumber);
        Index pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;

        while (pivot != Master_matrix::template get_null_value<ID_index>() &&
               pivotKiller != Master_matrix::template get_null_value<Index>()) {
          if constexpr (Master_matrix::Option_list::is_z2) {
            curr += _matrix()->get_column(pivotKiller);
          } else {
            auto& toadd = _matrix()->get_column(pivotKiller);
            typename Master_matrix::Element coef = toadd.get_pivot_value();
            auto& operators = _matrix()->colSettings_->operators;
            coef = operators.get_inverse(coef);
            operators.multiply_inplace(coef, operators.get_characteristic() - curr.get_pivot_value());
            curr.multiply_source_and_add(toadd, coef);
          }

          pivot = curr.get_pivot();
          it = idToPosition_.find(pivot);
          pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
          itNeg = negativeColumns.find(pivotColumnNumber);
          pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;
        }

        if (pivot != Master_matrix::template get_null_value<ID_index>()) {
          negativeColumns.emplace(pivotColumnNumber, i);
          _matrix()->get_column(pivotColumnNumber).clear();
          barcode_.emplace_back(pivotColumnNumber, i, dim - 1);
        } else {
          curr.clear();
          barcode_.emplace_back(i, nullDeath, dim);
        }
      }
    }
    --dim;
  }

  if constexpr (Master_matrix::Option_list::has_removable_columns) {
    // sort barcode by birth such that a removal is trivial
    std::sort(barcode_.begin(), barcode_.end(), [](const Bar& b1, const Bar& b2) { return b1.birth < b2.birth; });
    // map can only be constructed once barcode is sorted
    for (Index i = 0; i < barcode_.size(); ++i) {
      auto d = barcode_[i].death;
      if (d != Master_matrix::template get_null_value<Pos_index>()) {
        deathToBar_.emplace(d, i);
      }
    }
  }

  isReduced_ = true;
}